

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

int duckdb_brotli::BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  BrotliEncoderStateInternal *s;
  uint uVar4;
  long lVar5;
  size_t __n;
  long lVar6;
  size_t total_out;
  size_t local_60;
  size_t local_58;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  
  sVar1 = *encoded_size;
  local_58 = BrotliEncoderMaxCompressedSize(input_size);
  if (sVar1 == 0) {
    return 0;
  }
  if (input_size == 0) {
    *encoded_size = 1;
    *encoded_buffer = '\x06';
  }
  else {
    local_60 = sVar1;
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    if (s == (BrotliEncoderStateInternal *)0x0) {
      return 0;
    }
    available_out = *encoded_size;
    total_out = 0;
    next_out = encoded_buffer;
    if (s->is_initialized_ == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = input_size & 0xffffffff;
      if (0x18 < lgwin) {
        (s->params).large_window = 1;
      }
    }
    next_in = input_buffer;
    available_in = input_size;
    iVar2 = BrotliEncoderCompressStream
                      (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,&available_out,&next_out,
                       &total_out);
    if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
      iVar2 = 0;
    }
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if ((iVar2 == 0) || ((local_58 != 0 && (local_58 < *encoded_size)))) {
      *encoded_size = 0;
      if (local_60 <= local_58 - 1) {
        return 0;
      }
      encoded_buffer[0] = '!';
      encoded_buffer[1] = '\x03';
      lVar5 = 2;
      lVar6 = 0;
      for (; input_size != 0; input_size = input_size - __n) {
        __n = 0x1000000;
        if (input_size < 0x1000000) {
          __n = input_size;
        }
        iVar2 = 2 - (uint)(input_size < 0x100001);
        if (input_size < 0x10001) {
          iVar2 = 0;
        }
        uVar4 = ((int)__n * 8 + iVar2 * 2) - 8;
        uVar3 = 0x80000 << ((byte)(iVar2 << 2) & 0x1f) | uVar4;
        encoded_buffer[lVar5] = (uint8_t)uVar4;
        encoded_buffer[lVar5 + 1] = (uint8_t)((uint)((int)__n * 8 + -8) >> 8);
        encoded_buffer[lVar5 + 2] = (uint8_t)(uVar3 >> 0x10);
        if (input_size < 0x100001) {
          lVar5 = lVar5 + 3;
        }
        else {
          encoded_buffer[lVar5 + 3] = (uint8_t)(uVar3 >> 0x18);
          lVar5 = lVar5 + 4;
        }
        switchD_0193dc74::default(encoded_buffer + lVar5,input_buffer + lVar6,__n);
        lVar5 = lVar5 + __n;
        lVar6 = lVar6 + __n;
      }
      encoded_buffer[lVar5] = '\x03';
      *encoded_size = lVar5 + 1;
      return 1;
    }
  }
  return 1;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t input_buffer[BROTLI_ARRAY_PARAM(input_size)],
    size_t* encoded_size,
    uint8_t encoded_buffer[BROTLI_ARRAY_PARAM(*encoded_size)]) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    /* TODO(eustas): check that parameters are sane. */
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}